

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.c
# Opt level: O3

void BrotliSplitBlockLiteralsFromStored
               (MemoryManager *m,Command *cmds,size_t num_commands,size_t pos,size_t mask,
               BlockSplit *literal_split,BlockSplitFromDecoder *literal_split_decoder,
               size_t *cur_block_decoder)

{
  size_t __size;
  size_t sVar1;
  uint8_t *__dest;
  ulong uVar2;
  uint32_t *puVar3;
  void *__s;
  ulong uVar4;
  byte bVar5;
  int iVar6;
  size_t sVar7;
  uint32_t uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar10 = literal_split->types_alloc_size;
  uVar2 = literal_split_decoder->num_blocks;
  if (uVar10 < uVar2) {
    if (uVar10 == 0) {
      uVar10 = uVar2;
    }
    do {
      uVar4 = uVar10;
      uVar10 = uVar4 * 2;
    } while (uVar4 < uVar2);
    __dest = (uint8_t *)BrotliAllocate(m,uVar4);
    if (literal_split->types_alloc_size != 0) {
      memcpy(__dest,literal_split->types,literal_split->types_alloc_size);
    }
    BrotliFree(m,literal_split->types);
    literal_split->types = __dest;
    literal_split->types_alloc_size = uVar4;
    uVar2 = literal_split_decoder->num_blocks;
  }
  uVar10 = literal_split->lengths_alloc_size;
  if (uVar10 < uVar2) {
    if (uVar10 == 0) {
      uVar10 = uVar2;
    }
    do {
      uVar4 = uVar10;
      uVar10 = uVar4 * 2;
    } while (uVar4 < uVar2);
    puVar3 = (uint32_t *)BrotliAllocate(m,uVar4 * 4);
    if (literal_split->lengths_alloc_size != 0) {
      memcpy(puVar3,literal_split->lengths,literal_split->lengths_alloc_size << 2);
    }
    BrotliFree(m,literal_split->lengths);
    literal_split->lengths = puVar3;
    literal_split->lengths_alloc_size = uVar4;
  }
  literal_split->num_types = 0;
  literal_split->num_blocks = 0;
  sVar7 = literal_split_decoder->num_types;
  __size = sVar7 * 4;
  __s = malloc(__size);
  if (sVar7 != 0) {
    memset(__s,0xff,__size);
  }
  if (num_commands != 0) {
    sVar7 = *cur_block_decoder;
    uVar10 = 0;
    iVar6 = 0;
    lVar9 = 0;
    do {
      puVar3 = literal_split_decoder->positions_end;
      uVar2 = (ulong)puVar3[sVar7];
      if (uVar2 <= pos) {
        if (lVar9 != 0) {
          uVar11 = *(uint *)((long)__s + (ulong)literal_split_decoder->types[sVar7] * 4);
          if (uVar11 == 0xffffffff) {
            uVar11 = (uint)literal_split->num_types;
            *(uint *)((long)__s + (ulong)literal_split_decoder->types[sVar7] * 4) = uVar11;
          }
          sVar1 = literal_split->num_blocks;
          if ((sVar1 == 0) || (uVar11 != literal_split->types[sVar1 - 1])) {
            literal_split->types[sVar1] = (uint8_t)uVar11;
            sVar7 = literal_split->num_blocks;
            literal_split->lengths[sVar7] = (uint32_t)lVar9;
            uVar11 = (uint)literal_split->num_types;
            bVar5 = literal_split->types[sVar7] + 1;
            uVar12 = (uint)bVar5;
            if (bVar5 < (byte)uVar11) {
              uVar12 = uVar11;
            }
            literal_split->num_types = (ulong)(uVar12 & 0xff);
            literal_split->num_blocks = sVar7 + 1;
            sVar7 = *cur_block_decoder;
            puVar3 = literal_split_decoder->positions_end;
          }
          else {
            literal_split->lengths[sVar1 - 1] = literal_split->lengths[sVar1 - 1] + (uint32_t)lVar9;
          }
        }
        *cur_block_decoder = sVar7 + 1;
        uVar2 = (ulong)puVar3[sVar7 + 1];
        lVar9 = 0;
        sVar7 = sVar7 + 1;
      }
      if (uVar2 <= pos) {
        do {
          uVar2 = (ulong)puVar3[sVar7 + 1];
          sVar7 = sVar7 + 1;
        } while (uVar2 <= pos);
        *cur_block_decoder = sVar7;
      }
      uVar11 = literal_split_decoder->positions_begin[sVar7];
      uVar12 = cmds[uVar10].insert_len_;
      uVar4 = pos + uVar12;
      if (pos < uVar11) {
        if (uVar2 < uVar4) {
          lVar9 = lVar9 + (ulong)((int)uVar2 - uVar11);
          if (lVar9 != 0) {
            uVar11 = *(uint *)((long)__s + (ulong)literal_split_decoder->types[sVar7] * 4);
            if (uVar11 == 0xffffffff) {
              uVar11 = (uint)literal_split->num_types;
              *(uint *)((long)__s + (ulong)literal_split_decoder->types[sVar7] * 4) = uVar11;
            }
            sVar1 = literal_split->num_blocks;
            uVar8 = (uint32_t)lVar9;
            if ((sVar1 == 0) || (uVar11 != literal_split->types[sVar1 - 1])) {
              literal_split->types[sVar1] = (uint8_t)uVar11;
              sVar7 = literal_split->num_blocks;
              literal_split->lengths[sVar7] = uVar8;
LAB_00116ccc:
              uVar11 = (uint)literal_split->num_types;
              bVar5 = literal_split->types[sVar7] + 1;
              uVar12 = (uint)bVar5;
              if (bVar5 < (byte)uVar11) {
                uVar12 = uVar11;
              }
              literal_split->num_types = (ulong)(uVar12 & 0xff);
              literal_split->num_blocks = sVar7 + 1;
              sVar7 = *cur_block_decoder;
            }
            else {
              literal_split->lengths[sVar1 - 1] = literal_split->lengths[sVar1 - 1] + uVar8;
            }
          }
          goto LAB_00116cf5;
        }
        lVar9 = (lVar9 - (ulong)uVar11) + uVar4;
LAB_00116c99:
        pos = pos + ((cmds[uVar10].copy_len_ & 0x1ffffff) + uVar12);
        iVar6 = iVar6 + 1;
      }
      else {
        if (uVar4 <= uVar2) {
          lVar9 = lVar9 + (ulong)uVar12;
          goto LAB_00116c99;
        }
        lVar9 = (uVar2 - pos) + lVar9;
        if (lVar9 != 0) {
          uVar11 = *(uint *)((long)__s + (ulong)literal_split_decoder->types[sVar7] * 4);
          if (uVar11 == 0xffffffff) {
            uVar11 = (uint)literal_split->num_types;
            *(uint *)((long)__s + (ulong)literal_split_decoder->types[sVar7] * 4) = uVar11;
          }
          sVar1 = literal_split->num_blocks;
          uVar8 = (uint32_t)lVar9;
          if ((sVar1 == 0) || (uVar11 != literal_split->types[sVar1 - 1])) {
            literal_split->types[sVar1] = (uint8_t)uVar11;
            sVar7 = literal_split->num_blocks;
            literal_split->lengths[sVar7] = uVar8;
            goto LAB_00116ccc;
          }
          literal_split->lengths[sVar1 - 1] = literal_split->lengths[sVar1 - 1] + uVar8;
        }
LAB_00116cf5:
        sVar7 = sVar7 + 1;
        *cur_block_decoder = sVar7;
        lVar9 = 0;
      }
      uVar10 = (ulong)iVar6;
    } while (uVar10 < num_commands);
    if (lVar9 != 0) {
      uVar11 = *(uint *)((long)__s + (ulong)literal_split_decoder->types[*cur_block_decoder] * 4);
      if (uVar11 == 0xffffffff) {
        uVar11 = (uint)literal_split->num_types;
      }
      sVar7 = literal_split->num_blocks;
      if ((sVar7 == 0) || (uVar11 != literal_split->types[sVar7 - 1])) {
        literal_split->types[sVar7] = (uint8_t)uVar11;
        sVar7 = literal_split->num_blocks;
        literal_split->lengths[sVar7] = (uint32_t)lVar9;
        uVar11 = (uint)literal_split->num_types;
        bVar5 = literal_split->types[sVar7] + 1;
        uVar12 = (uint)bVar5;
        if (bVar5 < (byte)uVar11) {
          uVar12 = uVar11;
        }
        literal_split->num_types = (ulong)(uVar12 & 0xff);
        literal_split->num_blocks = sVar7 + 1;
      }
      else {
        literal_split->lengths[sVar7 - 1] = literal_split->lengths[sVar7 - 1] + (uint32_t)lVar9;
      }
    }
  }
  return;
}

Assistant:

void BrotliSplitBlockLiteralsFromStored(
                            MemoryManager* m,
                            const Command* cmds,
                            const size_t num_commands,
                            const size_t pos,
                            const size_t mask,
                            BlockSplit* literal_split,
                            const BlockSplitFromDecoder* literal_split_decoder,
                            size_t* cur_block_decoder) {
  BROTLI_ENSURE_CAPACITY(
      m, uint8_t, literal_split->types, literal_split->types_alloc_size,
      literal_split_decoder->num_blocks);
  BROTLI_ENSURE_CAPACITY(
      m, uint32_t, literal_split->lengths, literal_split->lengths_alloc_size,
      literal_split_decoder->num_blocks);
  size_t cur_pos = pos;
  literal_split->num_blocks = 0;
  literal_split->num_types = 0;
  size_t cur_length = 0;
  /* Mapping of the types from decoder (they increase with each metablock)
     to the appropriate types */
  int* types_mapping = (int*)malloc(sizeof(int) *
                                            literal_split_decoder->num_types);
  for (int i = 0; i < literal_split_decoder->num_types; ++i) {
    types_mapping[i] = -1;
  }

  int i = 0;
  while (i < num_commands) {
    /* Considering an interval of literals for current command:
       from cur_pos to cur_pos + insert_len*/

    /* If current literals interval lies after the current block
      that means we've finished the current block.
      If some literals have fallen inside current block before
      then need to save it*/
    if (cur_pos >= literal_split_decoder->positions_end[*cur_block_decoder]) {
      if (cur_length > 0) {
        /* If we haven't seen this decoder block type before
          then save a mapping of it to a current num_types */
        if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
          types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                      literal_split->num_types;
        }
        /* If the same block type as for a previous block then merge them */
        if (literal_split->num_blocks > 0 &&
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
              literal_split->types[literal_split->num_blocks - 1]) {
          literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
        } else {
          /* Map the decoder block type to an appropriate type */
          literal_split->types[literal_split->num_blocks] =
              types_mapping[literal_split_decoder->types[*cur_block_decoder]];
          literal_split->lengths[literal_split->num_blocks] = cur_length;
          literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                            literal_split->types[literal_split->num_blocks] + 1);
          literal_split->num_blocks++;
        }
        cur_length = 0;
      }
      (*cur_block_decoder)++;

    }
    /* Go through decoder blocks until a block with cur_pos inside is found */
    while (cur_pos >= literal_split_decoder->positions_end[*cur_block_decoder]) {
      (*cur_block_decoder)++;
    }
    /* Means that the first part of literals interval is already saved
       as a part of the previous block,
       now only need to look at the second part */
    if (cur_pos < literal_split_decoder->positions_begin[*cur_block_decoder]) {
      /* If literals interval ends inside the current block
         then increase an amount of literals for the current block */
      if (cur_pos + cmds[i].insert_len_ <=
                  literal_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length += cur_pos + cmds[i].insert_len_ -
                  literal_split_decoder->positions_begin[*cur_block_decoder];
        cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
        i++;
      }
      /* If literals interval ends after the current block
         then we've finished the block and need to save it */
      else {
        cur_length += literal_split_decoder->positions_end[*cur_block_decoder] -
                      literal_split_decoder->positions_begin[*cur_block_decoder];
        if (cur_length > 0) {
          if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
          }
          /* If the same block type as for a previous block then merge them */
          if (literal_split->num_blocks > 0 &&
              types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
                literal_split->types[literal_split->num_blocks - 1]) {
            literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
          } else {
            literal_split->types[literal_split->num_blocks] =
                types_mapping[literal_split_decoder->types[*cur_block_decoder]];
            literal_split->lengths[literal_split->num_blocks] = cur_length;
            literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
            literal_split->num_blocks++;
          }
          cur_length = 0;
        }
        (*cur_block_decoder)++;
      }
    }
    /* If literals interval starts inside the current block
       then look where it ends*/
    else if (cur_pos < literal_split_decoder->positions_end[*cur_block_decoder]) {
      /* If literals interval ends inside the current block
         then increase an amount of literals for the current block */
      if (cur_pos + cmds[i].insert_len_ <=
                literal_split_decoder->positions_end[*cur_block_decoder]) {
        cur_length += cmds[i].insert_len_;
        cur_pos += cmds[i].insert_len_ + CommandCopyLen(&cmds[i]);
        i++;
      }
      /* If literals interval ends after the current block
         then we've finished the block and need to save it */
      else {
        cur_length += literal_split_decoder->positions_end[*cur_block_decoder]
                                                                      - cur_pos;
        if (cur_length > 0) {
          if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
            types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
          }
          /* If the same block type as for a previous block then merge them */
          if (literal_split->num_blocks > 0 &&
              types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
                literal_split->types[literal_split->num_blocks - 1]) {
            literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
          } else {
            literal_split->types[literal_split->num_blocks] =
                    types_mapping[literal_split_decoder->types[*cur_block_decoder]];
            literal_split->lengths[literal_split->num_blocks] = cur_length;
            literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
            literal_split->num_blocks++;
          }
          cur_length = 0;
        }
        (*cur_block_decoder)++;
      }
    }
  }
  /* Save the last in metablock block */
  if (cur_length > 0) {
    if (types_mapping[literal_split_decoder->types[*cur_block_decoder]] == -1) {
      types_mapping[literal_split_decoder->types[*cur_block_decoder]] =
                                                        literal_split->num_types;
    }
    /* If the same block type as for a previous block then merge them */
    if (literal_split->num_blocks > 0 &&
        types_mapping[literal_split_decoder->types[*cur_block_decoder]] ==
          literal_split->types[literal_split->num_blocks - 1]) {
      literal_split->lengths[literal_split->num_blocks - 1] += cur_length;
    } else {
      literal_split->types[literal_split->num_blocks] =
                  types_mapping[literal_split_decoder->types[*cur_block_decoder]];
      literal_split->lengths[literal_split->num_blocks] = cur_length;
      literal_split->num_types = BROTLI_MAX(uint8_t, literal_split->num_types,
                              literal_split->types[literal_split->num_blocks] + 1);
      literal_split->num_blocks++;
    }
  }
}